

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddItem
          (cmComputeLinkInformation *this,string *item,cmGeneratorTarget *tgt)

{
  string *config;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  byte bVar4;
  cmGeneratorTarget *tgt_local;
  bool local_61;
  string linkItem;
  string exe;
  
  tgt_local = tgt;
  if (tgt != (cmGeneratorTarget *)0x0) {
    bVar1 = cmGeneratorTarget::IsExecutableWithExports(tgt);
    if (((bVar1) && (this->UseImportLibrary == false)) && (this->LoaderFlag == (char *)0x0)) {
      return;
    }
    bVar2 = cmGeneratorTarget::IsLinkable(tgt);
    if (bVar2) {
      config = &this->Config;
      if ((bVar1) && (this->LoaderFlag != (char *)0x0)) {
        linkItem._M_dataplus._M_p = (pointer)&linkItem.field_2;
        linkItem._M_string_length = 0;
        linkItem.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::assign((char *)&linkItem);
        cmGeneratorTarget::GetFullPath(&exe,tgt_local,config,(uint)this->UseImportLibrary,true);
        std::__cxx11::string::append((string *)&linkItem);
        local_61 = true;
        std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>::
        emplace_back<std::__cxx11::string&,bool,cmGeneratorTarget_const*&>
                  ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                    *)this,&linkItem,&local_61,&tgt_local);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &this->Depends,&exe);
        std::__cxx11::string::~string((string *)&exe);
      }
      else {
        TVar3 = cmGeneratorTarget::GetType(tgt);
        if (TVar3 == INTERFACE_LIBRARY) {
          linkItem._M_dataplus._M_p = (pointer)&linkItem.field_2;
          linkItem._M_string_length = 0;
          linkItem.field_2._M_local_buf[0] = '\0';
          exe._M_dataplus._M_p._0_1_ = 0;
          std::vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
          ::emplace_back<std::__cxx11::string,bool,cmGeneratorTarget_const*&>
                    ((vector<cmComputeLinkInformation::Item,std::allocator<cmComputeLinkInformation::Item>>
                      *)this,&linkItem,(bool *)&exe,&tgt_local);
          std::__cxx11::string::~string((string *)&linkItem);
          cmGeneratorTarget::GetImportedLibName(&linkItem,tgt_local,config);
          if (linkItem._M_string_length != 0) {
            AddItem(this,&linkItem,(cmGeneratorTarget *)0x0);
          }
        }
        else {
          TVar3 = cmGeneratorTarget::GetType(tgt);
          if (TVar3 == OBJECT_LIBRARY) {
            return;
          }
          bVar4 = this->UseImportLibrary;
          if (!bVar1 && (bool)bVar4 == true) {
            TVar3 = cmGeneratorTarget::GetType(tgt);
            bVar4 = TVar3 == SHARED_LIBRARY;
          }
          cmGeneratorTarget::GetFullPath(&linkItem,tgt,config,(uint)bVar4,true);
          if ((this->LinkDependsNoShared != true) ||
             (TVar3 = cmGeneratorTarget::GetType(tgt_local), TVar3 != SHARED_LIBRARY)) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->Depends,&linkItem);
          }
          AddTargetItem(this,&linkItem,tgt_local);
          AddLibraryRuntimeInfo(this,&linkItem,tgt_local);
        }
      }
      std::__cxx11::string::~string((string *)&linkItem);
      return;
    }
  }
  bVar1 = cmsys::SystemTools::FileIsFullPath(item);
  if (!bVar1) {
    AddUserItem(this,item,true);
    return;
  }
  bVar1 = cmsys::SystemTools::FileIsDirectory(item);
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Depends,item);
    AddFullItem(this,item);
    AddLibraryRuntimeInfo(this,item);
    return;
  }
  AddDirectoryItem(this,item);
  return;
}

Assistant:

void cmComputeLinkInformation::AddItem(std::string const& item,
                                       cmGeneratorTarget const* tgt)
{
  // Compute the proper name to use to link this library.
  const std::string& config = this->Config;
  bool impexe = (tgt && tgt->IsExecutableWithExports());
  if (impexe && !this->UseImportLibrary && !this->LoaderFlag) {
    // Skip linking to executables on platforms with no import
    // libraries or loader flags.
    return;
  }

  if (tgt && tgt->IsLinkable()) {
    // This is a CMake target.  Ask the target for its real name.
    if (impexe && this->LoaderFlag) {
      // This link item is an executable that may provide symbols
      // used by this target.  A special flag is needed on this
      // platform.  Add it now.
      std::string linkItem;
      linkItem = this->LoaderFlag;
      cmStateEnums::ArtifactType artifact = this->UseImportLibrary
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      std::string exe = tgt->GetFullPath(config, artifact, true);
      linkItem += exe;
      this->Items.emplace_back(linkItem, true, tgt);
      this->Depends.push_back(std::move(exe));
    } else if (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      // Add the interface library as an item so it can be considered as part
      // of COMPATIBLE_INTERFACE_ enforcement.  The generators will ignore
      // this for the actual link line.
      this->Items.emplace_back(std::string(), false, tgt);

      // Also add the item the interface specifies to be used in its place.
      std::string const& libName = tgt->GetImportedLibName(config);
      if (!libName.empty()) {
        this->AddItem(libName, nullptr);
      }
    } else if (tgt->GetType() == cmStateEnums::OBJECT_LIBRARY) {
      // Ignore object library!
      // Its object-files should already have been extracted for linking.
    } else {
      // Decide whether to use an import library.
      bool implib =
        (this->UseImportLibrary &&
         (impexe || tgt->GetType() == cmStateEnums::SHARED_LIBRARY));
      cmStateEnums::ArtifactType artifact = implib
        ? cmStateEnums::ImportLibraryArtifact
        : cmStateEnums::RuntimeBinaryArtifact;

      // Pass the full path to the target file.
      std::string lib = tgt->GetFullPath(config, artifact, true);
      if (!this->LinkDependsNoShared ||
          tgt->GetType() != cmStateEnums::SHARED_LIBRARY) {
        this->Depends.push_back(lib);
      }

      this->AddTargetItem(lib, tgt);
      this->AddLibraryRuntimeInfo(lib, tgt);
    }
  } else {
    // This is not a CMake target.  Use the name given.
    if (cmSystemTools::FileIsFullPath(item)) {
      if (cmSystemTools::FileIsDirectory(item)) {
        // This is a directory.
        this->AddDirectoryItem(item);
      } else {
        // Use the full path given to the library file.
        this->Depends.push_back(item);
        this->AddFullItem(item);
        this->AddLibraryRuntimeInfo(item);
      }
    } else {
      // This is a library or option specified by the user.
      this->AddUserItem(item, true);
    }
  }
}